

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

void __thiscall MathInterpreter::insertVariables(MathInterpreter *this,string *variable)

{
  Expression *pEVar1;
  iterator iVar2;
  mapped_type *ppVVar3;
  undefined8 *puVar4;
  undefined8 extraout_XMM0_Qa;
  string local_90;
  char *local_70 [4];
  undefined1 local_50 [8];
  string name;
  allocator local_21;
  
  std::__cxx11::string::find((char *)variable,0x10eac3);
  std::__cxx11::string::substr((ulong)local_50,(ulong)variable);
  std::__cxx11::string::substr((ulong)local_70,(ulong)variable);
  std::__cxx11::string::string((string *)&local_90,local_70[0],&local_21);
  pEVar1 = interpret(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_70);
  (**pEVar1->_vptr_Expression)(pEVar1);
  name.field_2._8_8_ = extraout_XMM0_Qa;
  (*pEVar1->_vptr_Expression[2])(pEVar1);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          ::find(&this->variables->_M_t,(key_type *)local_50);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->variables->_M_t)._M_impl.super__Rb_tree_header) {
    ppVVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
              ::at(this->variables,(key_type *)local_50);
    (*ppVVar3)->value = (double)name.field_2._8_8_;
    std::__cxx11::string::~string((string *)local_50);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "assign to unexist variable\n";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void MathInterpreter::insertVariables(string variable) {
  int p = variable.find("=");
  string name = variable.substr(0, p);
  Expression
      *e = this->interpret(variable.substr(p + 1, variable.length()).c_str());
  double value = e->calculate();
  delete e;
  if (this->variables->find(name) != this->variables->end()) {
    this->variables->at(name)->setValue(value);
  } else {
    throw ("assign to unexist variable\n");
  }
}